

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O2

void text_out_e(char *fmt,...)

{
  byte bVar1;
  char in_AL;
  uint8_t uVar2;
  int iVar3;
  byte *pbVar4;
  ushort **ppuVar5;
  char *pcVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  byte *pbVar7;
  byte *__haystack;
  byte *__s;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  byte *pbVar8;
  ulong __n;
  ulong uVar9;
  size_t __n_00;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char tagbuffer [16];
  va_list vp;
  undefined1 local_8e8 [8];
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  char smallbuf [1024];
  char buf [1024];
  
  vp[0].reg_save_area = local_8e8;
  if (in_AL != '\0') {
    local_8b8 = in_XMM0_Qa;
    local_8a8 = in_XMM1_Qa;
    local_898 = in_XMM2_Qa;
    local_888 = in_XMM3_Qa;
    local_878 = in_XMM4_Qa;
    local_868 = in_XMM5_Qa;
    local_858 = in_XMM6_Qa;
    local_848 = in_XMM7_Qa;
  }
  vp[0].overflow_arg_area = &stack0x00000008;
  vp[0].gp_offset = 8;
  vp[0].fp_offset = 0x30;
  local_8e0 = in_RSI;
  local_8d8 = in_RDX;
  local_8d0 = in_RCX;
  local_8c8 = in_R8;
  local_8c0 = in_R9;
  vstrnfmt(buf,0x400,fmt,vp);
  __n = 0;
  __s = (byte *)buf;
  do {
    if (*__s == 0) {
      return;
    }
    pbVar8 = __s;
    do {
      pbVar4 = (byte *)strchr((char *)pbVar8,0x7b);
      if (pbVar4 == (byte *)0x0) goto LAB_001ead12;
      pbVar8 = pbVar4 + 1;
      pbVar7 = pbVar4 + 2;
      uVar9 = (long)pbVar4 - (long)__s;
      __haystack = pbVar8;
      while( true ) {
        bVar1 = *__haystack;
        if ((ulong)bVar1 == 0) goto LAB_001ead12;
        ppuVar5 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x24) == 0) break;
        __haystack = __haystack + 1;
        pbVar7 = pbVar7 + 1;
        uVar9 = uVar9 + 1;
      }
    } while (bVar1 != 0x7d);
    pcVar6 = strstr((char *)__haystack,"{/}");
    if (pcVar6 == (char *)0x0) {
LAB_001ead12:
      __n_00 = strlen((char *)__s);
      pbVar4 = __s + __n_00;
      pbVar8 = (byte *)0x0;
    }
    else {
      __n_00 = (long)pbVar4 - (long)__s;
      if (__n_00 == 0) {
        pbVar8 = __s + 1;
        __s = __haystack + 1;
        __n_00 = (long)pcVar6 - (long)pbVar7;
        pbVar4 = (byte *)(pcVar6 + 3);
        __n = uVar9;
      }
      else {
        pbVar8 = (byte *)0x0;
      }
    }
    memcpy(smallbuf,__s,__n_00);
    smallbuf[__n_00] = '\0';
    if (pbVar8 == (byte *)0x0) {
      uVar2 = '\x01';
    }
    else {
      if (0xf < __n) {
        __assert_fail("taglen < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-textblock.c"
                      ,0x2a6,"void text_out_e(const char *, ...)");
      }
      memcpy(tagbuffer,pbVar8,__n);
      tagbuffer[__n] = '\0';
      iVar3 = color_text_to_attr(tagbuffer);
      uVar2 = (uint8_t)iVar3;
      if (iVar3 == -1) {
        uVar2 = '\x01';
      }
    }
    (*text_out_hook)(uVar2,smallbuf);
    __s = pbVar4;
  } while( true );
}

Assistant:

void text_out_e(const char *fmt, ...)
{
	char buf[1024];
	char smallbuf[1024];
	va_list vp;

	const char *start, *next, *text, *tag;
	size_t textlen, taglen = 0;

	/* Begin the Varargs Stuff */
	va_start(vp, fmt);

	/* Do the va_arg fmt to the buffer */
	(void)vstrnfmt(buf, sizeof(buf), fmt, vp);

	/* End the Varargs Stuff */
	va_end(vp);

	start = buf;
	while (next_section(start, 0, &text, &textlen, &tag, &taglen, &next)) {
		int a = -1;

		memcpy(smallbuf, text, textlen);
		smallbuf[textlen] = 0;

		if (tag) {
			char tagbuffer[16];

			/* Colour names are less than 16 characters long. */
			assert(taglen < 16);

			memcpy(tagbuffer, tag, taglen);
			tagbuffer[taglen] = '\0';

			a = color_text_to_attr(tagbuffer);
		}
		
		if (a == -1) 
			a = COLOUR_WHITE;

		/* Output now */
		text_out_hook(a, smallbuf);

		start = next;
	}
}